

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall QLocale::exponential(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData *pQVar1;
  ulong size;
  
  pQVar1 = ((this->d).d.ptr)->m_data;
  size = (ulong)pQVar1->m_exponential_size;
  if (size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QString::fromRawData
              ((QChar *)(
                        L".,%0-+e\"\'\xa0E«»„“”‘’‚‹›٫٬٪\x061c٠\x061c-\x061c+أس\x200e%\x200e\x200e-\x200e+০۰\x200e+\x200e×۱۰^−०၀「」『』\x200f-\x200f+اس𑄶×10^༠\x202f⹁𞥐𞤉ወ꯰،߀·10^\x200e−᱐Е"
                        + pQVar1->m_exponential_idx),size);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QLocale::exponential() const
{
    return d->m_data->exponentSeparator();
}